

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

UBool __thiscall icu_63::MessagePattern::isPlural(MessagePattern *this,int32_t index)

{
  short sVar1;
  uint uVar2;
  char16_t *pcVar3;
  
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar2 = *(uint *)((long)&(this->msg).fUnion + 4);
  }
  else {
    uVar2 = (int)sVar1 >> 5;
  }
  if ((uint)index < uVar2) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar3 = (this->msg).fUnion.fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&(this->msg).fUnion + 2);
    }
    if (((((((pcVar3[index] & 0xffdfU) == 0x50) && (index + 1U < uVar2)) &&
          ((pcVar3[(int)(index + 1U)] & 0xffdfU) == 0x4c)) &&
         ((index + 2U < uVar2 && ((pcVar3[(int)(index + 2U)] & 0xffdfU) == 0x55)))) &&
        ((index + 3U < uVar2 &&
         (((pcVar3[(int)(index + 3U)] & 0xffdfU) == 0x52 && (index + 4U < uVar2)))))) &&
       (((pcVar3[(int)(index + 4U)] & 0xffdfU) == 0x41 && (index + 5U < uVar2)))) {
      return (pcVar3[(int)(index + 5U)] & 0xffdfU) == 0x4c;
    }
  }
  return '\0';
}

Assistant:

inline UBool
UnicodeString::hasShortLength() const {
  return fUnion.fFields.fLengthAndFlags>=0;
}